

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetKotlinExtensionsClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor)

{
  FileDescriptor *file;
  string local_50;
  string_view local_30;
  Descriptor *local_20;
  Descriptor *descriptor_local;
  ClassNameResolver *this_local;
  
  local_20 = descriptor;
  descriptor_local = (Descriptor *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  java::(anonymous_namespace)::ClassNameWithoutPackageKotlin_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)descriptor,descriptor);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  file = Descriptor::file(local_20);
  GetClassFullName_abi_cxx11_(__return_storage_ptr__,this,local_30,file,true,true,true);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetKotlinExtensionsClassName(
    const Descriptor* descriptor) {
  return GetClassFullName(ClassNameWithoutPackageKotlin(descriptor),
                          descriptor->file(), /*immutable=*/true,
                          /*is_own_file=*/true,
                          /*kotlin=*/true);
}